

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  Lit LVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CRef CVar5;
  vec<Gluco::Solver::Watcher> *pvVar6;
  Watcher *pWVar7;
  Lit *pLVar8;
  Clause *pCVar9;
  VarData *cr;
  uint *puVar10;
  Var v_1;
  vec<Gluco::Solver::Watcher> *ws2;
  vec<Gluco::Solver::Watcher> *ws;
  int local_28;
  Lit p;
  int j;
  int i;
  int s;
  int v;
  ClauseAllocator *to_local;
  Solver *this_local;
  
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::cleanAll
            (&this->watchesBin);
  for (i = 0; iVar3 = nVars(this), i < iVar3; i = i + 1) {
    for (j = 0; j < 2; j = j + 1) {
      ws._4_4_ = mkLit(i,j != 0);
      pvVar6 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
               ::operator[](&this->watches,(Lit *)((long)&ws + 4));
      for (local_28 = 0; iVar3 = local_28, iVar4 = vec<Gluco::Solver::Watcher>::size(pvVar6),
          iVar3 < iVar4; local_28 = local_28 + 1) {
        pWVar7 = vec<Gluco::Solver::Watcher>::operator[](pvVar6,local_28);
        ClauseAllocator::reloc(&this->ca,&pWVar7->cref,to);
      }
      pvVar6 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
               ::operator[](&this->watchesBin,(Lit *)((long)&ws + 4));
      for (local_28 = 0; iVar3 = local_28, iVar4 = vec<Gluco::Solver::Watcher>::size(pvVar6),
          iVar3 < iVar4; local_28 = local_28 + 1) {
        pWVar7 = vec<Gluco::Solver::Watcher>::operator[](pvVar6,local_28);
        ClauseAllocator::reloc(&this->ca,&pWVar7->cref,to);
      }
    }
  }
  p.x = 0;
  do {
    LVar1.x = p.x;
    iVar3 = vec<Gluco::Lit>::size(&this->trail);
    if (iVar3 <= LVar1.x) {
      for (p.x = 0; LVar1.x = p.x, iVar3 = vec<unsigned_int>::size(&this->learnts), LVar1.x < iVar3;
          p.x = p.x + 1) {
        puVar10 = vec<unsigned_int>::operator[](&this->learnts,p.x);
        ClauseAllocator::reloc(&this->ca,puVar10,to);
      }
      for (p.x = 0; LVar1.x = p.x, iVar3 = vec<unsigned_int>::size(&this->clauses), LVar1.x < iVar3;
          p.x = p.x + 1) {
        puVar10 = vec<unsigned_int>::operator[](&this->clauses,p.x);
        ClauseAllocator::reloc(&this->ca,puVar10,to);
      }
      return;
    }
    pLVar8 = vec<Gluco::Lit>::operator[](&this->trail,p.x);
    iVar3 = Gluco::var((Lit)pLVar8->x);
    CVar5 = reason(this,iVar3);
    if (CVar5 != 0xffffffff) {
      CVar5 = reason(this,iVar3);
      pCVar9 = ClauseAllocator::operator[](&this->ca,CVar5);
      bVar2 = Clause::reloced(pCVar9);
      if (!bVar2) {
        CVar5 = reason(this,iVar3);
        pCVar9 = ClauseAllocator::operator[](&this->ca,CVar5);
        bVar2 = locked(this,pCVar9);
        if (!bVar2) goto LAB_00731f09;
      }
      cr = vec<Gluco::Solver::VarData>::operator[](&this->vardata,iVar3);
      ClauseAllocator::reloc(&this->ca,&cr->reason,to);
    }
LAB_00731f09:
    p.x = p.x + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    int v, s, i, j;
    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    for (v = 0; v < nVars(); v++)
        for (s = 0; s < 2; s++){
            Lit p = mkLit(v, s != 0);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher>& ws = watches[p];
            for (j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec<Watcher>& ws2 = watchesBin[p];
            for (j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
        }

    // All reasons:
    //
    for (i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for (i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    // All original:
    //
    for (i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);
}